

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

ssize_t __thiscall QRingBuffer::read(QRingBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  QRingChunk *pQVar1;
  void *pvVar2;
  char *__src;
  undefined4 in_register_00000034;
  long lVar3;
  void *__ptr;
  
  if ((long)this->bufferSize < (long)__buf) {
    __buf = (void *)this->bufferSize;
  }
  for (lVar3 = 0; pvVar2 = (void *)((long)__buf - lVar3),
      pvVar2 != (void *)0x0 && lVar3 <= (long)__buf; lVar3 = lVar3 + (long)__ptr) {
    if (this->bufferSize == 0) {
      __ptr = (void *)0x0;
    }
    else {
      pQVar1 = (this->buffers).d.ptr;
      __ptr = (void *)(pQVar1->tailOffset - pQVar1->headOffset);
    }
    if ((long)pvVar2 < (long)__ptr) {
      __ptr = pvVar2;
    }
    if (CONCAT44(in_register_00000034,__fd) != 0) {
      __src = readPointer(this);
      memcpy((void *)(CONCAT44(in_register_00000034,__fd) + lVar3),__src,(size_t)__ptr);
    }
    free(this,__ptr);
  }
  return lVar3;
}

Assistant:

qint64 QRingBuffer::read(char *data, qint64 maxLength)
{
    const qint64 bytesToRead = qMin(size(), maxLength);
    qint64 readSoFar = 0;
    while (readSoFar < bytesToRead) {
        const qint64 bytesToReadFromThisBlock = qMin(bytesToRead - readSoFar,
                                                     nextDataBlockSize());
        if (data)
            memcpy(data + readSoFar, readPointer(), bytesToReadFromThisBlock);
        readSoFar += bytesToReadFromThisBlock;
        free(bytesToReadFromThisBlock);
    }
    return readSoFar;
}